

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall
ki::dml::Field<unsigned_char>::set_value(Field<unsigned_char> *this,FieldBase *other)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  char *pcVar5;
  value_error *this_00;
  ostringstream oss;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  sVar2 = std::type_info::hash_code((type_info *)&unsigned_char::typeinfo);
  if (sVar2 == other->m_type_hash) {
    lVar3 = __dynamic_cast(other,&FieldBase::typeinfo,&typeinfo,0);
    this->m_value = *(uchar *)(lVar3 + 0x38);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Tried to copy value from ",0x19);
  iVar1 = (*(other->super_Serializable)._vptr_Serializable[5])(other);
  poVar4 = std::operator<<((ostream *)local_198,(char *)CONCAT44(extraout_var,iVar1));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," field to ",10);
  pcVar5 = get_type_name(this);
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," field.",7);
  this_00 = (value_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_00,&sStack_1b8);
  __cxa_throw(this_00,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void set_value(FieldBase *other) final
		{
			if (other->is_type<ValueT>())
			{
				auto *real_other = dynamic_cast<Field<ValueT> *>(other);
				set_value(real_other->get_value());
			}
			else
			{
				std::ostringstream oss;
				oss << "Tried to copy value from " <<
					other->get_type_name() << " field to " <<
					get_type_name() << " field.";
				throw value_error(oss.str());
			}
		}